

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::midString(String *this,int left,int len)

{
  int in_ECX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar1;
  undefined4 in_register_00000034;
  long lVar2;
  String SVar3;
  int local_4c;
  undefined1 local_30 [8];
  tagbstring t;
  int len_local;
  int left_local;
  String *this_local;
  
  lVar2 = CONCAT44(in_register_00000034,left);
  t.data._0_4_ = in_ECX;
  t.data._4_4_ = len;
  if (in_ECX < 0) {
    if (-in_ECX < *(int *)(lVar2 + 4)) {
      if (len < 0) {
        t.data._4_4_ = max<int>(0,*(int *)(lVar2 + 4) + len);
        t.data._0_4_ = (*(int *)(lVar2 + 4) + (int)t.data) - t.data._4_4_;
      }
      else {
        t.data._0_4_ = *(int *)(lVar2 + 4) + in_ECX;
      }
    }
    else {
      t.data._4_4_ = 0;
    }
  }
  if (t.data._4_4_ < 0) {
    if ((int)t.data == -t.data._4_4_ ||
        SBORROW4((int)t.data,-t.data._4_4_) != (int)t.data + t.data._4_4_ < 0) {
      local_4c = (int)t.data;
    }
    else {
      local_4c = -t.data._4_4_;
    }
    t.data._0_4_ = local_4c;
    t.data._4_4_ = *(int *)(lVar2 + 4) + t.data._4_4_;
  }
  if (*(int *)(lVar2 + 4) - t.data._4_4_ < (int)t.data) {
    t.data._0_4_ = *(int *)(lVar2 + 4) - t.data._4_4_;
  }
  if (((int)t.data < 1) || (t.data._4_4_ < 0)) {
    String(this,"");
    puVar1 = extraout_RDX;
  }
  else {
    local_30._4_4_ = (int)t.data;
    local_30._0_4_ = -1;
    t._0_8_ = *(long *)(lVar2 + 8) + (long)t.data._4_4_;
    String(this,(tagbstring *)local_30);
    puVar1 = extraout_RDX_00;
  }
  SVar3.super_tagbstring.data = puVar1;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

const String String::midString(int left, int len) const
    {
        struct tagbstring t;
        if (len < 0)
        {   // Want data from the right of the string, without specifying the start point
            // For example String("abcdefgh").midString(0, -3) => "abcde"
            if (-len >= slen) left = 0;
            else
            {   // Check for String("abcdef").midString(-3, -1) => "de"
                if (left < 0) { left = max(0, slen + left); len = slen + len - left; }
                else len += slen;
            }
        }
        if (left < 0)
        {   // Want data from the right of the string
            len = len > -left ? -left : len;
            left = slen + left;
        }
        if (len > slen - left)    len = slen - left;
        if (len <= 0 || left < 0)    return String("");
        blk2tbstr(t, data + left, len);
        return String(t);
    }